

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void XML_ParserFree(XML_Parser parser)

{
  tag *ptVar1;
  binding *pbVar2;
  DTD *table;
  XML_Parser pXVar3;
  NAMED **ppNVar4;
  size_t sVar5;
  long lVar6;
  BINDING *pBVar7;
  TAG *pTVar8;
  long lVar9;
  OPEN_INTERNAL_ENTITY *pOVar10;
  OPEN_INTERNAL_ENTITY *pOVar11;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  pTVar8 = parser->m_tagStack;
  do {
    if (pTVar8 == (TAG *)0x0) {
      pTVar8 = parser->m_freeTagList;
      if (pTVar8 == (TAG *)0x0) {
        pOVar10 = parser->m_openInternalEntities;
        do {
          pOVar11 = pOVar10;
          if (pOVar10 == (OPEN_INTERNAL_ENTITY *)0x0) {
            pOVar11 = parser->m_freeInternalEntities;
            if (pOVar11 == (OPEN_INTERNAL_ENTITY *)0x0) {
              pBVar7 = parser->m_freeBindingList;
              while (pBVar7 != (BINDING *)0x0) {
                pbVar2 = pBVar7->nextTagBinding;
                (*(parser->m_mem).free_fcn)(pBVar7->uri);
                (*(parser->m_mem).free_fcn)(pBVar7);
                pBVar7 = pbVar2;
              }
              pBVar7 = parser->m_inheritedBindings;
              while (pBVar7 != (BINDING *)0x0) {
                pbVar2 = pBVar7->nextTagBinding;
                (*(parser->m_mem).free_fcn)(pBVar7->uri);
                (*(parser->m_mem).free_fcn)(pBVar7);
                pBVar7 = pbVar2;
              }
              poolDestroy(&parser->m_tempPool);
              poolDestroy(&parser->m_temp2Pool);
              (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
              table = parser->m_dtd;
              if (table != (DTD *)0x0) {
                pXVar3 = parser->m_parentParser;
                ppNVar4 = (table->elementTypes).v;
                sVar5 = (table->elementTypes).size;
                for (lVar9 = 0; sVar5 << 3 != lVar9; lVar9 = lVar9 + 8) {
                  lVar6 = *(long *)((long)ppNVar4 + lVar9);
                  if ((lVar6 != 0) && (*(int *)(lVar6 + 0x1c) != 0)) {
                    (*(parser->m_mem).free_fcn)(*(void **)(lVar6 + 0x20));
                  }
                }
                hashTableDestroy(&table->generalEntities);
                hashTableDestroy(&table->elementTypes);
                hashTableDestroy(&table->attributeIds);
                hashTableDestroy(&table->prefixes);
                poolDestroy(&table->pool);
                poolDestroy(&table->entityValuePool);
                if (pXVar3 == (XML_Parser)0x0) {
                  (*(parser->m_mem).free_fcn)(table->scaffIndex);
                  (*(parser->m_mem).free_fcn)(table->scaffold);
                }
                (*(parser->m_mem).free_fcn)(table);
              }
              (*(parser->m_mem).free_fcn)(parser->m_atts);
              (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
              (*(parser->m_mem).free_fcn)(parser->m_buffer);
              (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
              (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
              (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
              if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
                (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
              }
              (*(parser->m_mem).free_fcn)(parser);
              return;
            }
            parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
          }
          pOVar10 = pOVar11->next;
          (*(parser->m_mem).free_fcn)(pOVar11);
        } while( true );
      }
      parser->m_freeTagList = (TAG *)0x0;
    }
    ptVar1 = pTVar8->parent;
    (*(parser->m_mem).free_fcn)(pTVar8->buf);
    pBVar7 = pTVar8->bindings;
    while (pBVar7 != (BINDING *)0x0) {
      pbVar2 = pBVar7->nextTagBinding;
      (*(parser->m_mem).free_fcn)(pBVar7->uri);
      (*(parser->m_mem).free_fcn)(pBVar7);
      pBVar7 = pbVar2;
    }
    (*(parser->m_mem).free_fcn)(pTVar8);
    pTVar8 = ptVar1;
  } while( true );
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser)
{
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free tagStack and freeTagList */
  tagList = tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (freeTagList == NULL)
        break;
      tagList = freeTagList;
      freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  /* free openInternalEntities and freeInternalEntities */
  entityList = openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (freeInternalEntities == NULL)
        break;
      entityList = freeInternalEntities;
      freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(openEntity);
  }

  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
  FREE((void *)protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (!isParamEntity && _dtd)
#else
  if (_dtd)
#endif /* XML_DTD */
    dtdDestroy(_dtd, (XML_Bool)!parentParser, &parser->m_mem);
  FREE((void *)atts);
#ifdef XML_ATTR_INFO
  FREE((void *)attInfo);
#endif
  FREE(groupConnector);
  FREE(buffer);
  FREE(dataBuf);
  FREE(nsAtts);
  FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}